

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::setupTest(DecodeToggledCase *this)

{
  int height;
  string *in_RCX;
  ComparisonFunction *paramsComparisonFunction;
  Vec4 *color;
  WrapMode wrapS;
  WrapMode in_stack_fffffffffffffe18;
  allocator<char> local_1e1;
  FilterMode in_stack_fffffffffffffe20;
  FilterMode in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  FragmentShaderParameters shaderParametersB;
  FragmentShaderParameters shaderParametersA;
  ComparisonFunction colorsEqualFunction;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ComparisonFunction srgbToLinearFunction;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderParametersA,"srgbToLinearCheck",
             (allocator<char> *)&colorsEqualFunction);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderParametersB,
             "mediump vec4 srgbToLinearCheck(in mediump vec4 texelSRGBA, in mediump vec4 texelLinear) \n{ \n\tconst int NUM_CHANNELS = 4;\tmediump vec4 texelSRGBAConverted; \n\tmediump vec4 epsilonErr = vec4(0.005); \n\tmediump vec4 testResult; \n\tfor (int idx = 0; idx < NUM_CHANNELS; idx++) \n\t{ \n\t\ttexelSRGBAConverted[idx] = pow( (texelSRGBA[idx] + 0.055) / 1.055, 1.0 / 0.4116); \n\t} \n\tif ( all(lessThan(abs(texelSRGBAConverted - texelLinear), epsilonErr)) || all(equal(texelSRGBAConverted, texelLinear)) ) \n\t{ \n\t\treturn testResult = vec4(0.0, 1.0, 0.0, 1.0); \n\t} \n\telse \n\t{ \n\t\treturn testResult = vec4(1.0, 0.0, 0.0, 1.0); \n\t} \n} \n"
             ,(allocator<char> *)&stack0xfffffffffffffe20);
  ComparisonFunction::ComparisonFunction
            (&srgbToLinearFunction,(string *)&shaderParametersA,
             (FunctionParameters)&shaderParametersB,in_RCX);
  std::__cxx11::string::~string((string *)&shaderParametersB);
  std::__cxx11::string::~string((string *)&shaderParametersA);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderParametersA,"colorsEqualCheck",
             (allocator<char> *)&stack0xfffffffffffffe20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderParametersB,
             "mediump vec4 colorsEqualCheck(in mediump vec4 colorA, in mediump vec4 colorB) \n{ \n\tmediump vec4 epsilonErr = vec4(0.005); \n\tmediump vec4 testResult; \n\tif ( all(lessThan(abs(colorA - colorB), epsilonErr)) || all(equal(colorA, colorB)) ) \n\t{ \n\t\treturn testResult = vec4(0.0, 1.0, 0.0, 1.0); \n\t} \n\telse \n\t{ \n\t\treturn testResult = vec4(1.0, 0.0, 0.0, 1.0); \n\t} \n} \n"
             ,&local_1e1);
  ComparisonFunction::ComparisonFunction
            (&colorsEqualFunction,(string *)&shaderParametersA,
             (FunctionParameters)&shaderParametersB,in_RCX);
  std::__cxx11::string::~string((string *)&shaderParametersB);
  std::__cxx11::string::~string((string *)&shaderParametersA);
  FragmentShaderParameters::FragmentShaderParameters
            (&shaderParametersA,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,&srgbToLinearFunction,
             BLENDING_NOT_REQUIRED,TOGGLING_NOT_REQUIRED);
  paramsComparisonFunction = &colorsEqualFunction;
  color = (Vec4 *)0x0;
  wrapS = CLAMP_TO_EDGE;
  FragmentShaderParameters::FragmentShaderParameters
            (&shaderParametersB,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,paramsComparisonFunction,
             BLENDING_REQUIRED,TOGGLING_REQUIRED);
  height = (int)paramsComparisonFunction;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe20,"uTexture0",&local_1e1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &shaderParametersB.uniformsToToggle,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffe20);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
  local_68 = 0x3e99999a3e4ccccd;
  uStack_60 = 0x3f8000003ecccccd;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_68,0,height,color,wrapS,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe30);
  local_78 = 0x3e99999a3e4ccccd;
  uStack_70 = 0x3f8000003ecccccd;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&local_78,1,height,color,wrapS,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe30);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,&shaderParametersA);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,&shaderParametersB);
  (this->super_SRGBTestCase).m_py = 0;
  (this->super_SRGBTestCase).m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  (this->super_SRGBTestCase).m_px = 0;
  FragmentShaderParameters::~FragmentShaderParameters(&shaderParametersB);
  FragmentShaderParameters::~FragmentShaderParameters(&shaderParametersA);
  ComparisonFunction::~ComparisonFunction(&colorsEqualFunction);
  ComparisonFunction::~ComparisonFunction(&srgbToLinearFunction);
  return;
}

Assistant:

void DecodeToggledCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT and texture_b to DECODE_EXT
	//	- create and use two seperate shader programs, program_a and program_b, each using different fragment shaders
	//	- store texture_a and texture_b on GPU
	// FIRST PASS:
	//	- use program_a
	//	- in fragment shader, sample both textures using texture*() and manually perform sRGB to lRGB conversion on texture_a
	//	- in fragment shader, test converted texture_a value with texture_b
	//	- render green image for pass or red for fail
	//	- store result in a color attachement 0
	// TOGGLE STAGE
	//	- during rendering, toggle texture_a from DECODE_SKIP_EXT to DECODE_EXT
	// SECOND PASS:
	//	- use program_b
	//	- in fragment shader, sample both textures using texture*() and manually perform equality check. Both should be linear
	//	- blend first pass result with second pass. Anything but a green result equals fail

	ComparisonFunction srgbToLinearFunction("srgbToLinearCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionSRGBToLinearCheck());
	ComparisonFunction colorsEqualFunction("colorsEqualCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionEqualCheck());

	FragmentShaderParameters shaderParametersA(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &srgbToLinearFunction, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);
	FragmentShaderParameters shaderParametersB(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &colorsEqualFunction, BLENDING_REQUIRED, TOGGLING_REQUIRED);

	// need to specify which texture uniform to toggle DECODE_EXT/SKIP_DECODE_EXT
	shaderParametersB.uniformsToToggle.push_back("uTexture0");

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE);

	this->addShaderProgram(shaderParametersA);
	this->addShaderProgram(shaderParametersB);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);
	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}